

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::expand(QTreeViewPrivate *this,int item,bool emitSignal)

{
  QAbstractItemModel *pQVar1;
  Int IVar2;
  QTreeViewPrivate *this_00;
  const_reference pQVar3;
  reference pQVar4;
  ulong uVar5;
  undefined1 in_DL;
  int in_ESI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QTreeViewPrivate *unaff_retaddr;
  QTreeView *q;
  QModelIndex index;
  undefined4 in_stack_ffffffffffffffa8;
  State in_stack_ffffffffffffffac;
  undefined3 in_stack_ffffffffffffffc0;
  uint uVar6;
  QPersistentModelIndex in_stack_ffffffffffffffd0;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  QAbstractItemModel *local_10;
  long lVar7;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = CONCAT13(in_DL,in_stack_ffffffffffffffc0) & 0x1ffffff;
  this_00 = (QTreeViewPrivate *)q_func(in_RDI);
  if ((in_ESI != -1) &&
     (pQVar3 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
     (*(ulong *)&pQVar3->field_0x1c & 1) == 0)) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QList<QTreeViewItem>::at
                       ((QList<QTreeViewItem> *)in_RDI,
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_20 = *(undefined1 **)&pQVar3->index;
    local_18 = (undefined1 *)(pQVar3->index).i;
    local_10 = (pQVar3->index).m.ptr;
    QModelIndex::flags((QModelIndex *)in_RDI);
    local_24.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&((QFlags<Qt::ItemFlag> *)in_RDI,in_stack_ffffffffffffffac);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
    if (IVar2 == 0) {
      if (((uVar6 & 0x1000000) != 0) && ((in_RDI->animationsEnabled & 1U) != 0)) {
        prepareAnimatedOperation(unaff_retaddr,(int)((ulong)lVar7 >> 0x20),(Direction)lVar7);
      }
      if ((in_RDI->super_QAbstractItemViewPrivate).state != AnimatingState) {
        (in_RDI->super_QAbstractItemViewPrivate).stateBeforeAnimation =
             (in_RDI->super_QAbstractItemViewPrivate).state;
      }
      QAbstractItemView::setState((QAbstractItemView *)in_RDI,in_stack_ffffffffffffffac);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)&stack0xffffffffffffffd0,(QModelIndex *)&local_20);
      storeExpanded((QTreeViewPrivate *)CONCAT44(in_ESI,uVar6),(QPersistentModelIndex *)this_00);
      QPersistentModelIndex::~QPersistentModelIndex
                ((QPersistentModelIndex *)&stack0xffffffffffffffd0);
      pQVar4 = QList<QTreeViewItem>::operator[]
                         ((QList<QTreeViewItem> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      *(ulong *)&pQVar4->field_0x1c = *(ulong *)&pQVar4->field_0x1c & 0xfffffffffffffffe | 1;
      layout((QTreeViewPrivate *)index.m.ptr,index.i._4_4_,index.i._3_1_,index.i._2_1_);
      QAbstractItemView::setState((QAbstractItemView *)in_RDI,in_stack_ffffffffffffffac);
      pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
      uVar5 = (**(code **)(*(long *)pQVar1 + 0x130))(pQVar1,&local_20);
      if ((uVar5 & 1) != 0) {
        pQVar1 = (in_RDI->super_QAbstractItemViewPrivate).model;
        (**(code **)(*(long *)pQVar1 + 0x128))(pQVar1,&local_20);
      }
      if (((uVar6 & 0x1000000) != 0) &&
         (QTreeView::expanded((QTreeView *)in_RDI,
                              (QModelIndex *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
         (in_RDI->animationsEnabled & 1U) != 0)) {
        beginAnimatedOperation((QTreeViewPrivate *)in_stack_ffffffffffffffd0.d);
      }
      updateAccessibility(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar7) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::expand(int item, bool emitSignal)
{
    Q_Q(QTreeView);

    if (item == -1 || viewItems.at(item).expanded)
        return;
    const QModelIndex index = viewItems.at(item).index;
    if (index.flags() & Qt::ItemNeverHasChildren)
        return;

#if QT_CONFIG(animation)
    if (emitSignal && animationsEnabled)
        prepareAnimatedOperation(item, QVariantAnimation::Forward);
#endif // animation
     //if already animating, stateBeforeAnimation is set to the correct value
    if (state != QAbstractItemView::AnimatingState)
        stateBeforeAnimation = state;
    q->setState(QAbstractItemView::ExpandingState);
    storeExpanded(index);
    viewItems[item].expanded = true;
    layout(item);
    q->setState(stateBeforeAnimation);

    if (model->canFetchMore(index))
        model->fetchMore(index);
    if (emitSignal) {
        emit q->expanded(index);
#if QT_CONFIG(animation)
        if (animationsEnabled)
            beginAnimatedOperation();
#endif // animation
    }
    updateAccessibility();
}